

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O3

void chacha20_block(uint32_t *initial_state,uchar *keystream)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint local_98;
  long local_90;
  uint local_88 [18];
  uint32_t *local_40;
  uchar *local_38;
  
  local_88[4] = (uint)*(undefined8 *)(initial_state + 4);
  local_88[5] = (uint)((ulong)*(undefined8 *)(initial_state + 4) >> 0x20);
  local_88[0] = (uint)*(undefined8 *)initial_state;
  local_88[1] = (uint)((ulong)*(undefined8 *)initial_state >> 0x20);
  local_88[0xc] = (uint)*(undefined8 *)(initial_state + 0xc);
  local_88[0xd] = (uint)((ulong)*(undefined8 *)(initial_state + 0xc) >> 0x20);
  local_88[8] = (uint)*(undefined8 *)(initial_state + 8);
  local_88[9] = (uint)((ulong)*(undefined8 *)(initial_state + 8) >> 0x20);
  local_98 = local_88[9];
  local_88[6] = (uint)*(undefined8 *)(initial_state + 6);
  local_88[2] = (uint)*(undefined8 *)(initial_state + 2);
  local_88[0xe] = (uint)*(undefined8 *)(initial_state + 0xe);
  local_88[10] = (uint)*(undefined8 *)(initial_state + 10);
  local_88[7] = (uint)((ulong)*(undefined8 *)(initial_state + 6) >> 0x20);
  local_88[3] = (uint)((ulong)*(undefined8 *)(initial_state + 2) >> 0x20);
  local_88[0xf] = (uint)((ulong)*(undefined8 *)(initial_state + 0xe) >> 0x20);
  local_90 = 10;
  local_88[0xb] = (uint)((ulong)*(undefined8 *)(initial_state + 10) >> 0x20);
  do {
    local_88[0xc] = local_88[0xc] ^ local_88[0] + local_88[4];
    uVar4 = local_88[0xc] << 0x10 | local_88[0xc] >> 0x10;
    local_88[8] = local_88[8] + uVar4;
    uVar7 = local_88[4] ^ local_88[8];
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    local_88[0] = local_88[0] + local_88[4] + uVar7;
    uVar4 = uVar4 ^ local_88[0];
    uVar5 = uVar4 << 8 | uVar4 >> 0x18;
    local_88[8] = local_88[8] + uVar5;
    uVar7 = uVar7 ^ local_88[8];
    uVar8 = uVar7 << 7 | uVar7 >> 0x19;
    local_88[0xd] = local_88[0xd] ^ local_88[1] + local_88[5];
    uVar4 = local_88[0xd] << 0x10 | local_88[0xd] >> 0x10;
    local_98 = local_98 + uVar4;
    uVar7 = local_88[5] ^ local_98;
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    local_88[1] = local_88[1] + local_88[5] + uVar7;
    uVar4 = uVar4 ^ local_88[1];
    uVar4 = uVar4 << 8 | uVar4 >> 0x18;
    local_98 = local_98 + uVar4;
    uVar7 = uVar7 ^ local_98;
    uVar6 = uVar7 << 7 | uVar7 >> 0x19;
    local_88[0xe] = local_88[0xe] ^ local_88[2] + local_88[6];
    uVar7 = local_88[0xe] << 0x10 | local_88[0xe] >> 0x10;
    local_88[10] = local_88[10] + uVar7;
    uVar2 = local_88[6] ^ local_88[10];
    uVar2 = uVar2 << 0xc | uVar2 >> 0x14;
    local_88[2] = local_88[2] + local_88[6] + uVar2;
    uVar7 = uVar7 ^ local_88[2];
    uVar7 = uVar7 << 8 | uVar7 >> 0x18;
    local_88[10] = local_88[10] + uVar7;
    uVar2 = uVar2 ^ local_88[10];
    uVar3 = uVar2 << 7 | uVar2 >> 0x19;
    local_88[0xf] = local_88[0xf] ^ local_88[3] + local_88[7];
    uVar2 = local_88[0xf] << 0x10 | local_88[0xf] >> 0x10;
    local_88[0xb] = local_88[0xb] + uVar2;
    uVar9 = local_88[7] ^ local_88[0xb];
    uVar9 = uVar9 << 0xc | uVar9 >> 0x14;
    local_88[3] = local_88[3] + local_88[7] + uVar9;
    uVar2 = uVar2 ^ local_88[3];
    uVar2 = uVar2 << 8 | uVar2 >> 0x18;
    local_88[0xb] = local_88[0xb] + uVar2;
    uVar9 = uVar9 ^ local_88[0xb];
    uVar9 = uVar9 << 7 | uVar9 >> 0x19;
    local_88[0] = local_88[0] + uVar6;
    uVar2 = uVar2 ^ local_88[0];
    uVar2 = uVar2 << 0x10 | uVar2 >> 0x10;
    local_88[10] = local_88[10] + uVar2;
    uVar6 = uVar6 ^ local_88[10];
    uVar6 = uVar6 << 0xc | uVar6 >> 0x14;
    local_88[0] = local_88[0] + uVar6;
    uVar2 = uVar2 ^ local_88[0];
    local_88[0xf] = uVar2 << 8 | uVar2 >> 0x18;
    local_88[10] = local_88[10] + local_88[0xf];
    uVar6 = uVar6 ^ local_88[10];
    local_88[5] = uVar6 << 7 | uVar6 >> 0x19;
    local_88[1] = local_88[1] + uVar3;
    uVar5 = uVar5 ^ local_88[1];
    uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
    local_88[0xb] = local_88[0xb] + uVar5;
    uVar3 = uVar3 ^ local_88[0xb];
    uVar2 = uVar3 << 0xc | uVar3 >> 0x14;
    local_88[1] = local_88[1] + uVar2;
    uVar5 = uVar5 ^ local_88[1];
    local_88[0xc] = uVar5 << 8 | uVar5 >> 0x18;
    local_88[0xb] = local_88[0xb] + local_88[0xc];
    uVar2 = uVar2 ^ local_88[0xb];
    local_88[6] = uVar2 << 7 | uVar2 >> 0x19;
    local_88[2] = local_88[2] + uVar9;
    uVar4 = uVar4 ^ local_88[2];
    uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
    local_88[8] = local_88[8] + uVar4;
    uVar9 = uVar9 ^ local_88[8];
    uVar2 = uVar9 << 0xc | uVar9 >> 0x14;
    local_88[2] = local_88[2] + uVar2;
    uVar4 = uVar4 ^ local_88[2];
    local_88[0xd] = uVar4 << 8 | uVar4 >> 0x18;
    local_88[8] = local_88[8] + local_88[0xd];
    uVar2 = uVar2 ^ local_88[8];
    local_88[7] = uVar2 << 7 | uVar2 >> 0x19;
    local_88[3] = local_88[3] + uVar8;
    uVar7 = uVar7 ^ local_88[3];
    uVar4 = uVar7 << 0x10 | uVar7 >> 0x10;
    local_98 = local_98 + uVar4;
    uVar8 = uVar8 ^ local_98;
    uVar7 = uVar8 << 0xc | uVar8 >> 0x14;
    local_88[3] = local_88[3] + uVar7;
    uVar4 = uVar4 ^ local_88[3];
    local_88[0xe] = uVar4 << 8 | uVar4 >> 0x18;
    local_98 = local_98 + local_88[0xe];
    uVar7 = uVar7 ^ local_98;
    local_88[4] = uVar7 << 7 | uVar7 >> 0x19;
    local_90 = local_90 + -1;
  } while (local_90 != 0);
  local_88[1] = local_88[1] + initial_state[1];
  local_88[0] = local_88[0] + *initial_state;
  local_88[3] = local_88[3] + initial_state[3];
  local_88[2] = local_88[2] + initial_state[2];
  local_88[5] = local_88[5] + initial_state[5];
  local_88[4] = local_88[4] + initial_state[4];
  local_88[7] = local_88[7] + initial_state[7];
  local_88[6] = local_88[6] + initial_state[6];
  local_88[9] = local_98 + initial_state[9];
  local_88[8] = local_88[8] + initial_state[8];
  local_88[0xb] = local_88[0xb] + initial_state[0xb];
  local_88[10] = local_88[10] + initial_state[10];
  local_88[0xd] = local_88[0xd] + initial_state[0xd];
  local_88[0xc] = local_88[0xc] + initial_state[0xc];
  local_88[0xf] = local_88[0xf] + initial_state[0xf];
  local_88[0xe] = local_88[0xe] + initial_state[0xe];
  lVar1 = 0;
  do {
    *(uint *)(keystream + lVar1 * 4) = local_88[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  local_40 = initial_state;
  local_38 = keystream;
  mbedtls_platform_zeroize(local_88,0x40);
  return;
}

Assistant:

static void chacha20_block( const uint32_t initial_state[16],
                            unsigned char keystream[64] )
{
    uint32_t working_state[16];
    size_t i;

    memcpy( working_state,
            initial_state,
            CHACHA20_BLOCK_SIZE_BYTES );

    for( i = 0U; i < 10U; i++ )
        chacha20_inner_block( working_state );

    working_state[ 0] += initial_state[ 0];
    working_state[ 1] += initial_state[ 1];
    working_state[ 2] += initial_state[ 2];
    working_state[ 3] += initial_state[ 3];
    working_state[ 4] += initial_state[ 4];
    working_state[ 5] += initial_state[ 5];
    working_state[ 6] += initial_state[ 6];
    working_state[ 7] += initial_state[ 7];
    working_state[ 8] += initial_state[ 8];
    working_state[ 9] += initial_state[ 9];
    working_state[10] += initial_state[10];
    working_state[11] += initial_state[11];
    working_state[12] += initial_state[12];
    working_state[13] += initial_state[13];
    working_state[14] += initial_state[14];
    working_state[15] += initial_state[15];

    for( i = 0U; i < 16; i++ )
    {
        size_t offset = i * 4U;

        keystream[offset     ] = (unsigned char)( working_state[i]       );
        keystream[offset + 1U] = (unsigned char)( working_state[i] >>  8 );
        keystream[offset + 2U] = (unsigned char)( working_state[i] >> 16 );
        keystream[offset + 3U] = (unsigned char)( working_state[i] >> 24 );
    }

    mbedtls_platform_zeroize( working_state, sizeof( working_state ) );
}